

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall
kratos::LatchVisitor::AssignedVarVisitor::~AssignedVarVisitor(AssignedVarVisitor *this)

{
  ~AssignedVarVisitor(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

void visit(AssignStmt* stmt) override {
            auto* left = stmt->left();
            if (left->type() == VarType::Slice) {
                auto* slice = reinterpret_cast<VarSlice*>(left);
                if (slice->sliced_by_var()) {
                    return;
                }
                left = const_cast<Var*>(slice->get_var_root_parent());
            }
            assigned_vars_[left].emplace_back(stmt);
        }